

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# training.cc
# Opt level: O0

void __thiscall
dynet::SimpleSGDTrainer::update_params(SimpleSGDTrainer *this,real scale,real gscale,size_t idx)

{
  initializer_list<dynet::Tensor_*> __l;
  vector<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_> *this_00;
  size_type in_RSI;
  long *in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM1_Da;
  value_type *p;
  vector<dynet::Tensor_*,_std::allocator<dynet::Tensor_*>_> *in_stack_ffffffffffffff90;
  Tensor *__a;
  Tensor *this_01;
  iterator ppTVar1;
  size_type sVar2;
  undefined1 local_38 [24];
  const_reference local_20;
  size_type local_18;
  undefined4 local_10;
  undefined4 local_c;
  
  local_18 = in_RSI;
  local_10 = in_XMM1_Da;
  local_c = in_XMM0_Da;
  this_00 = Model::parameters_list((Model *)in_RDI[7]);
  local_20 = std::vector<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_>::
             operator[](this_00,local_18);
  __a = &(*local_20)->values;
  this_01 = &(*local_20)->g;
  ppTVar1 = (iterator)&stack0xffffffffffffffa8;
  sVar2 = 2;
  std::allocator<dynet::Tensor_*>::allocator((allocator<dynet::Tensor_*> *)0xc7f0a5);
  __l._M_len = sVar2;
  __l._M_array = ppTVar1;
  std::vector<dynet::Tensor_*,_std::allocator<dynet::Tensor_*>_>::vector
            ((vector<dynet::Tensor_*,_std::allocator<dynet::Tensor_*>_> *)this_01,__l,
             (allocator_type *)__a);
  (**(code **)(*in_RDI + 0x18))(local_c,local_10,in_RDI,local_38);
  std::vector<dynet::Tensor_*,_std::allocator<dynet::Tensor_*>_>::~vector(in_stack_ffffffffffffff90)
  ;
  std::allocator<dynet::Tensor_*>::~allocator((allocator<dynet::Tensor_*> *)0xc7f0f4);
  return;
}

Assistant:

void SimpleSGDTrainer::update_params(real scale, real gscale, size_t idx) {
  auto & p = model->parameters_list()[idx];
  update_rule(scale, gscale, {&p->values, &p->g});
}